

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMipsInstruction.cpp
# Opt level: O1

int __thiscall CMipsInstruction::floatToHalfFloat(CMipsInstruction *this,int i)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)i >> 0x10 & 0x8000;
  uVar3 = (uint)i >> 0x17 & 0xff;
  uVar2 = i & 0x7fffff;
  if (uVar3 < 0x71) {
    if (uVar3 < 0x66) {
      return uVar1;
    }
    uVar2 = ((uVar2 | 0x800000) >> (0x71U - (char)((uint)i >> 0x17) & 0x1f)) >> 0xd;
LAB_00180511:
    return uVar1 | uVar2;
  }
  if (uVar3 - 0x70 == 0x8f) {
    if (uVar2 != 0) {
      return (uint)i >> 0x10 | 0x7fff;
    }
  }
  else if (uVar3 < 0x8f) {
    uVar2 = uVar2 >> 0xd | (uVar3 - 0x70) * 0x400;
    goto LAB_00180511;
  }
  return uVar1 | 0x7c00;
}

Assistant:

int CMipsInstruction::floatToHalfFloat(int i)
{
	int s = ((i >> 16) & 0x00008000); // sign
	int e = ((i >> 23) & 0x000000ff) - (127 - 15); // exponent
	int f = ((i >> 0) & 0x007fffff); // fraction

	// need to handle NaNs and Inf?
	if (e <= 0) {
		if (e < -10) {
			if (s != 0) {
				// handle -0.0
				return 0x8000;
			}
			return 0;
		}
		f = (f | 0x00800000) >> (1 - e);
		return s | (f >> 13);
	} else if (e == 0xff - (127 - 15)) {
		if (f == 0) {
			// Inf
			return s | 0x7c00;
		}
		// NAN
		return s | 0x7fff;
	}

	if (e > 30) {
		// Overflow
		return s | 0x7c00;
	}

	return s | (e << 10) | (f >> 13);
}